

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O1

int compress2(Bytef *dest,uLongf *destLen,Bytef *source,uLong sourceLen,int level)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uLongf uVar4;
  z_stream local_a0;
  
  uVar4 = *destLen;
  *destLen = 0;
  local_a0.opaque = (voidpf)0x0;
  local_a0.zalloc = (alloc_func)0x0;
  local_a0.zfree = (free_func)0x0;
  iVar1 = deflateInit_(&local_a0,level,"1.3.0.1-motley",0x70);
  if (iVar1 == 0) {
    local_a0.avail_out = 0;
    local_a0.avail_in = 0;
    local_a0.next_in = source;
    local_a0.next_out = dest;
    do {
      if (local_a0.avail_out == 0) {
        uVar3 = 0xffffffff;
        if (uVar4 < 0xffffffff) {
          uVar3 = uVar4;
        }
        local_a0.avail_out = (uInt)uVar3;
        uVar4 = uVar4 - uVar3;
      }
      if (local_a0.avail_in == 0) {
        uVar3 = 0xffffffff;
        if (sourceLen < 0xffffffff) {
          uVar3 = sourceLen;
        }
        local_a0.avail_in = (uInt)uVar3;
        sourceLen = sourceLen - uVar3;
      }
      iVar2 = deflate(&local_a0,(uint)(sourceLen == 0) << 2);
    } while (iVar2 == 0);
    *destLen = local_a0.total_out;
    deflateEnd(&local_a0);
    iVar1 = 0;
    if (iVar2 != 1) {
      iVar1 = iVar2;
    }
  }
  return iVar1;
}

Assistant:

int ZEXPORT compress2(Bytef *dest, uLongf *destLen, const Bytef *source,
                      uLong sourceLen, int level) {
    z_stream stream;
    int err;
    const uInt max = (uInt)-1;
    uLong left;

    left = *destLen;
    *destLen = 0;

    stream.zalloc = (alloc_func)0;
    stream.zfree = (free_func)0;
    stream.opaque = (voidpf)0;

    err = deflateInit(&stream, level);
    if (err != Z_OK) return err;

    stream.next_out = dest;
    stream.avail_out = 0;
    stream.next_in = (z_const Bytef *)source;
    stream.avail_in = 0;

    do {
        if (stream.avail_out == 0) {
            stream.avail_out = left > (uLong)max ? max : (uInt)left;
            left -= stream.avail_out;
        }
        if (stream.avail_in == 0) {
            stream.avail_in = sourceLen > (uLong)max ? max : (uInt)sourceLen;
            sourceLen -= stream.avail_in;
        }
        err = deflate(&stream, sourceLen ? Z_NO_FLUSH : Z_FINISH);
    } while (err == Z_OK);

    *destLen = stream.total_out;
    deflateEnd(&stream);
    return err == Z_STREAM_END ? Z_OK : err;
}